

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O3

string * __thiscall
t_haxe_generator::argument_list_abi_cxx11_
          (string *__return_storage_ptr__,t_haxe_generator *this,t_struct *tstruct)

{
  undefined8 *puVar1;
  pointer pcVar2;
  bool bVar3;
  undefined8 *puVar4;
  pointer pptVar5;
  ulong uVar6;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 *local_a0;
  undefined8 local_90;
  undefined8 uStack_88;
  string local_80;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  t_haxe_generator *local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar5 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar3 = true;
    do {
      if (!bVar3) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pcVar2 = ((*pptVar5)->name_)._M_dataplus._M_p;
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar2,pcVar2 + ((*pptVar5)->name_)._M_string_length);
      std::__cxx11::string::append((char *)&local_60);
      type_name_abi_cxx11_(&local_80,local_38,(*pptVar5)->type_,false,false);
      uVar6 = 0xf;
      if (local_60 != local_50) {
        uVar6 = local_50[0];
      }
      if (uVar6 < local_80._M_string_length + local_58) {
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          uVar7 = local_80.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_80._M_string_length + local_58) goto LAB_00233f6a;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_60);
      }
      else {
LAB_00233f6a:
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80._M_dataplus._M_p)
        ;
      }
      puVar1 = puVar4 + 2;
      if ((undefined8 *)*puVar4 == puVar1) {
        local_90 = *puVar1;
        uStack_88 = puVar4[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *puVar1;
        local_a0 = (undefined8 *)*puVar4;
      }
      *puVar4 = puVar1;
      puVar4[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
      if (local_a0 != &local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if (local_60 != local_50) {
        operator_delete(local_60);
      }
      pptVar5 = pptVar5 + 1;
      bVar3 = false;
    } while (pptVar5 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_haxe_generator::argument_list(t_struct* tstruct) {
  string result = "";

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      result += ", ";
    }
    result += (*f_iter)->get_name() + " : " + type_name((*f_iter)->get_type());
  }
  return result;
}